

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::Psbt::AddTxInData(Psbt *this,UtxoData *utxo,uint32_t sequence)

{
  uint32_t uVar1;
  long in_RSI;
  Psbt *in_RDI;
  wally_psbt *psbt_pointer;
  CfdException *except;
  uint32_t index;
  Script redeem_script;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  TxOut txout;
  OutPoint outpoint;
  undefined1 in_stack_0000035f;
  Script *in_stack_00000360;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00000368;
  TxOut *in_stack_00000370;
  OutPoint *in_stack_00000378;
  UtxoData *in_stack_00000380;
  NetType *in_stack_00000390;
  Script *in_stack_fffffffffffffe40;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe74;
  OutPoint *in_stack_fffffffffffffe78;
  Psbt *in_stack_fffffffffffffe80;
  TxOutReference local_148;
  uint32_t local_f4;
  Script local_f0;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_b8;
  TxOut local_90;
  OutPoint local_40;
  
  core::OutPoint::OutPoint(&local_40,(Txid *)(in_RSI + 0x28),*(uint32_t *)(in_RSI + 0x48));
  core::TxOut::TxOut(&local_90);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector(&local_b8);
  core::Script::Script(&local_f0);
  ConvertFromUtxoData(in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_00000368,
                      in_stack_00000360,(bool)in_stack_0000035f,in_stack_00000390);
  uVar1 = AddTxIn(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
  local_f4 = uVar1;
  core::TxOutReference::TxOutReference(&local_148,&local_90);
  core::Psbt::SetTxInUtxo(in_RDI,uVar1,&local_148,&local_f0,&local_b8);
  core::TxOutReference::~TxOutReference((TxOutReference *)0x51d5bd);
  uVar1 = local_f4;
  core::Script::~Script(in_stack_fffffffffffffe40);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            (in_stack_fffffffffffffe50);
  core::TxOut::~TxOut((TxOut *)0x51d78f);
  core::OutPoint::~OutPoint((OutPoint *)0x51d79c);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxInData(const UtxoData& utxo, uint32_t sequence) {
  OutPoint outpoint(utxo.txid, utxo.vout);
  TxOut txout;
  std::vector<KeyData> key_list;
  Script redeem_script;
  ConvertFromUtxoData(utxo, nullptr, &txout, &key_list, &redeem_script);

  uint32_t index = AddTxIn(outpoint, sequence);
  try {
    cfd::core::Psbt::SetTxInUtxo(
        index, TxOutReference(txout), redeem_script, key_list);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_input(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}